

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4.test.cpp
# Opt level: O1

string * chunkWithAnalyticalFunctions_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 1.270000+2 8.934780+0          0          1          0          0  27 7  4     \n 0.000000+0 0.000000+0          0          0          6          0  27 7  4     \n 0.000000+0 1.976285+2 8.934780+0 5.000001+0 0.000000+0 1.000000+0  27 7  4     \n 0.000000+0 0.000000+0          0          0          1          3  27 7  4     \n          3          2                                              27 7  4     \n 2.936000+2 5.332083+2 6.000000+2 7.354726+2 1.200000+3 1.270678+3  27 7  4     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkWithAnalyticalFunctions() {
  return
    " 1.270000+2 8.934780+0          0          1          0          0  27 7  4     \n"
    " 0.000000+0 0.000000+0          0          0          6          0  27 7  4     \n"
    " 0.000000+0 1.976285+2 8.934780+0 5.000001+0 0.000000+0 1.000000+0  27 7  4     \n"
    " 0.000000+0 0.000000+0          0          0          1          3  27 7  4     \n"
    "          3          2                                              27 7  4     \n"
    " 2.936000+2 5.332083+2 6.000000+2 7.354726+2 1.200000+3 1.270678+3  27 7  4     \n";
}